

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_initCStream_usingCDict_advanced
                 (ZSTD_CStream *zcs,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  long lVar5;
  ZSTD_CCtx_params *pZVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  ZSTD_CCtx_params in_stack_ffffffffffffff08;
  undefined1 local_78 [12];
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined8 uStack_60;
  undefined8 local_58;
  uint local_50;
  
  if (cdict != (ZSTD_CDict *)0x0) {
    pZVar6 = &zcs->requestedParams;
    puVar7 = (undefined8 *)local_78;
    for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *(undefined8 *)pZVar6;
      pZVar6 = (ZSTD_CCtx_params *)&(pZVar6->cParams).chainLog;
      puVar7 = puVar7 + 1;
    }
    uVar1 = (cdict->cParams).hashLog;
    uVar2 = (cdict->cParams).searchLog;
    uVar3 = (cdict->cParams).searchLength;
    uStack_64 = uVar3;
    uStack_60._0_4_ = (cdict->cParams).targetLength;
    uStack_60._4_4_ = (cdict->cParams).strategy;
    local_78._4_4_ = (cdict->cParams).windowLog;
    local_78._8_4_ = (cdict->cParams).chainLog;
    uStack_6c = uVar1;
    local_68 = uVar2;
    local_58 = fParams._0_8_;
    local_50 = fParams.noDictIDFlag;
    puVar7 = (undefined8 *)local_78;
    puVar8 = (undefined8 *)&stack0xffffffffffffff08;
    for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + 1;
      puVar8 = puVar8 + 1;
    }
    sVar4 = ZSTD_initCStream_internal
                      (zcs,(void *)0x0,0,cdict,in_stack_ffffffffffffff08,pledgedSrcSize);
    return sVar4;
  }
  return 0xffffffffffffffe0;
}

Assistant:

size_t ZSTD_initCStream_usingCDict_advanced(ZSTD_CStream* zcs,
                                            const ZSTD_CDict* cdict,
                                            ZSTD_frameParameters fParams,
                                            unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingCDict_advanced");
    if (!cdict) return ERROR(dictionary_wrong); /* cannot handle NULL cdict (does not know what to do) */
    {   ZSTD_CCtx_params params = zcs->requestedParams;
        params.cParams = ZSTD_getCParamsFromCDict(cdict);
        params.fParams = fParams;
        return ZSTD_initCStream_internal(zcs,
                                NULL, 0, cdict,
                                params, pledgedSrcSize);
    }
}